

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ModportItemSyntax * __thiscall slang::parsing::Parser::parseModportItem(Parser *this)

{
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  MemberSyntax *pMVar4;
  undefined4 extraout_var;
  AnsiPortListSyntax *ports;
  ModportItemSyntax *pMVar6;
  Info *pIVar7;
  Info *pIVar8;
  Info *extraout_RDX;
  size_t extraout_RDX_00;
  BumpAllocator *dst;
  TokenKind TVar9;
  TokenKind TVar10;
  ulong uVar11;
  Token TVar12;
  Token TVar13;
  Token name;
  Token closeParen;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_210;
  undefined1 local_200;
  Info *local_1f8;
  undefined8 local_1f0;
  Token openParen;
  Token current;
  SeparatedSyntaxList<slang::syntax::MemberSyntax> local_1c8 [7];
  pointer pTVar5;
  
  TVar12 = ParserBase::expect(&this->super_ParserBase,Identifier);
  local_1f8 = TVar12.info;
  local_1f0 = TVar12._0_8_;
  Token::Token(&openParen);
  Token::Token(&closeParen);
  openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  if ((openParen._0_4_ >> 0x10 & 1) != 0) {
    SVar3 = Token::location(&openParen);
    closeParen = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,SVar3);
    local_1c8[0].super_SyntaxListBase.childCount = 0;
    pTVar5 = (pointer)0x0;
    goto LAB_001d23eb;
  }
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = Unknown;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode._4_4_ = 0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x10;
  TVar12 = ParserBase::peek(&this->super_ParserBase);
  current = TVar12;
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar12.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location(&current);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x460005,SVar3);
    }
LAB_001d223a:
    closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    pIVar7 = closeParen.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleModportPort(TVar12.kind);
    if (bVar1) {
      do {
        do {
          pIVar7 = TVar12.info;
          pMVar4 = parseModportPort(this);
          local_210._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pMVar4;
          local_200 = 1;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_210._M_first);
          TVar13 = ParserBase::peek(&this->super_ParserBase);
          TVar9 = TVar13.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9);
          if (TVar9 == EndOfFile || bVar1) goto LAB_001d223a;
          if (TVar9 != Comma) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleModportPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x460005,false);
              if (!bVar1) goto LAB_001d223a;
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_210._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_200 = 0;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_210._M_first);
          TVar13 = ParserBase::peek(&this->super_ParserBase);
          pIVar8 = TVar13.info;
          TVar9 = TVar13.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9);
          if (TVar9 == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            goto LAB_001d223a;
          }
          TVar10 = TVar12.kind;
          uVar11 = TVar13._0_8_ & 0xffffffff;
          TVar12.info = pIVar8;
          TVar12.kind = (short)uVar11;
          TVar12._2_1_ = (char)(uVar11 >> 0x10);
          TVar12.numFlags.raw = (char)(uVar11 >> 0x18);
          TVar12.rawLen = (int)(uVar11 >> 0x20);
        } while (pIVar7 != pIVar8 || TVar10 != TVar9);
        bVar1 = ParserBase::
                skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleModportPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                          (&this->super_ParserBase,(DiagCode)0x460005,true);
        uVar11 = TVar13._0_8_ & 0xffffffff;
        TVar12.kind = (short)uVar11;
        TVar12._2_1_ = (char)(uVar11 >> 0x10);
        TVar12.numFlags.raw = (char)(uVar11 >> 0x18);
        TVar12.rawLen = (int)(uVar11 >> 0x20);
      } while (bVar1);
      goto LAB_001d223a;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,TVar12,CloseParenthesis,&closeParen,(DiagCode)0x460005);
    pIVar7 = extraout_RDX;
  }
  dst = (this->super_ParserBase).alloc;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,(EVP_PKEY_CTX *)dst,
                     (EVP_PKEY_CTX *)pIVar7);
  pTVar5 = (pointer)CONCAT44(extraout_var,iVar2);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,(EVP_PKEY_CTX *)dst);
  local_1c8[0].super_SyntaxListBase.childCount = extraout_RDX_00;
LAB_001d23eb:
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e7e18;
  local_1c8[0].elements._M_ptr = pTVar5;
  local_1c8[0].elements._M_extent._M_extent_value = local_1c8[0].super_SyntaxListBase.childCount;
  ports = slang::syntax::SyntaxFactory::ansiPortList(&this->factory,openParen,local_1c8,closeParen);
  name.info = local_1f8;
  name.kind = (undefined2)local_1f0;
  name._2_1_ = local_1f0._2_1_;
  name.numFlags.raw = local_1f0._3_1_;
  name.rawLen = local_1f0._4_4_;
  pMVar6 = slang::syntax::SyntaxFactory::modportItem(&this->factory,name,ports);
  return pMVar6;
}

Assistant:

ModportItemSyntax& Parser::parseModportItem() {
    auto name = expect(TokenKind::Identifier);

    Token openParen, closeParen;
    std::span<TokenOrSyntax> items;
    parseList<isPossibleModportPort, isEndOfParenList>(
        TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma, openParen, items,
        closeParen, RequireItems::True, diag::ExpectedModportPort,
        [this] { return &parseModportPort(); });

    auto& ports = factory.ansiPortList(openParen, items, closeParen);
    return factory.modportItem(name, ports);
}